

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption_bogus.cc
# Opt level: O0

fdb_status bogus_crypt(encryptor *e,bool encrypt,void *dst_buf,void *src_buf,size_t size,bid_t bid)

{
  uint8_t *dst;
  uint8_t *src;
  int8_t delta;
  bid_t bid_local;
  size_t size_local;
  void *src_buf_local;
  void *dst_buf_local;
  bool encrypt_local;
  encryptor *e_local;
  
  delta = (byte)bid ^ (e->key).bytes[0];
  dst = (uint8_t *)dst_buf;
  src = (uint8_t *)src_buf;
  size_local = size;
  if (!encrypt) {
    delta = -delta;
  }
  while (size_local != 0) {
    *dst = *src + delta;
    dst = dst + 1;
    src = src + 1;
    size_local = size_local - 1;
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

static fdb_status bogus_crypt(encryptor *e,
                              bool encrypt,
                              void *dst_buf,
                              const void *src_buf,
                              size_t size,
                              bid_t bid)
{
    int8_t delta = (bid & 0xFF) ^ e->key.bytes[0];
    if (!encrypt)
        delta = -delta;
    const uint8_t *src = (const uint8_t *)src_buf;
    uint8_t *dst = (uint8_t *)dst_buf;
    while (size-- > 0) {
        *dst++ = *src++ + delta;
    }
    return FDB_RESULT_SUCCESS;
}